

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_constant_names_generated.c
# Opt level: O0

char * psa_ka_algorithm_name(psa_algorithm_t ka_alg)

{
  char *pcStack_10;
  psa_algorithm_t ka_alg_local;
  
  if (ka_alg == 0x30000000) {
    pcStack_10 = "PSA_ALG_CATEGORY_KEY_AGREEMENT";
  }
  else if (ka_alg == 0x30100000) {
    pcStack_10 = "PSA_ALG_FFDH";
  }
  else if (ka_alg == 0x30200000) {
    pcStack_10 = "PSA_ALG_ECDH";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char *psa_ka_algorithm_name(psa_algorithm_t ka_alg)
{
    switch (ka_alg) {
    case PSA_ALG_CATEGORY_KEY_AGREEMENT: return "PSA_ALG_CATEGORY_KEY_AGREEMENT";
    case PSA_ALG_ECDH: return "PSA_ALG_ECDH";
    case PSA_ALG_FFDH: return "PSA_ALG_FFDH";
    default: return NULL;
    }
}